

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

void __thiscall
Disa::Adjacency_Graph<true>::Adjacency_Graph
          (Adjacency_Graph<true> *this,
          initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph)

{
  size_t size_vertex;
  const_iterator ppVar1;
  const_iterator __last;
  _func_bool_Edge_ptr_Edge_ptr *__comp;
  size_type size_edge;
  pair<unsigned_long,_unsigned_long> *edge;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> *__range2;
  _lambda_std__pair_const__std__pair_const___2_ local_29;
  pair<unsigned_long,_unsigned_long> *local_28;
  pair<unsigned_long,_unsigned_long> *iter;
  Adjacency_Graph<true> *this_local;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph_local;
  
  edge_graph_local._M_array = (iterator)edge_graph._M_len;
  this_local = (Adjacency_Graph<true> *)edge_graph._M_array;
  iter = (pair<unsigned_long,_unsigned_long> *)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->vertex_adjacent_list);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->offset);
  ppVar1 = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::begin
                     ((initializer_list<std::pair<unsigned_long,_unsigned_long>_> *)&this_local);
  __last = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::end
                     ((initializer_list<std::pair<unsigned_long,_unsigned_long>_> *)&this_local);
  __comp = Disa::Adjacency_Graph::Adjacency_Graph(std::initializer_list)::
           {lambda(std::pair_const&,std::pair_const&)#2}::operator_cast_to_function_pointer
                     (&local_29);
  local_28 = std::
             max_element<std::pair<unsigned_long,unsigned_long>const*,bool(*)(std::pair<unsigned_long,unsigned_long>const&,std::pair<unsigned_long,unsigned_long>const&)>
                       (ppVar1,__last,
                        (_func_bool_pair<unsigned_long,_unsigned_long>_ptr_pair<unsigned_long,_unsigned_long>_ptr
                         *)__comp);
  size_vertex = local_28->first;
  size_edge = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::size
                        ((initializer_list<std::pair<unsigned_long,_unsigned_long>_> *)&this_local);
  reserve(this,size_vertex,size_edge);
  __end2 = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::begin
                     ((initializer_list<std::pair<unsigned_long,_unsigned_long>_> *)&this_local);
  ppVar1 = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::end
                     ((initializer_list<std::pair<unsigned_long,_unsigned_long>_> *)&this_local);
  for (; __end2 != ppVar1; __end2 = __end2 + 1) {
    insert(this,__end2);
  }
  shrink_to_fit(this);
  return;
}

Assistant:

Adjacency_Graph<_directed>::Adjacency_Graph(std::initializer_list<Edge> edge_graph) {
  const auto iter = std::max_element(edge_graph.begin(), edge_graph.end(),
                                     !_directed ?
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return order_edge_vertex(&edge_0).second < order_edge_vertex(&edge_1).second;
                                        } :
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return edge_0.second < edge_1.second;
                                        });
  reserve(!_directed ? std::max(iter->first, iter->second) : iter->first, edge_graph.size());
  FOR_EACH(edge, edge_graph) insert(edge);
  shrink_to_fit();
}